

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O3

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeTriang>::TPZCompElHDiv
          (TPZCompElHDiv<pzshape::TPZShapeTriang> *this,TPZCompMesh *mesh,TPZGeoEl *gel,
          HDivFamily hdivfam)

{
  IntruleType *this_00;
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  int64_t nelem;
  TPZConnect *pTVar4;
  TPZGeoEl *this_01;
  long *plVar5;
  int icon;
  long lVar6;
  int order_1;
  TPZManVector<int,_3> order;
  TPZManVector<int,_3> ord;
  TPZStack<int,_10> facesides;
  int local_dc;
  TPZVec<int> local_d8;
  int local_b8;
  int local_b4;
  int local_b0;
  TPZManVector<int,_3> local_a8;
  TPZManVector<int,_10> local_78;
  
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_018fce20;
  TPZIntelGen<pzshape::TPZShapeTriang>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapeTriang>,&PTR_PTR_018f9d70,mesh,gel,1);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElHDiv_018f9998;
  TPZVec<int>::TPZVec(&(this->fSideOrient).super_TPZVec<int>,0);
  (this->fSideOrient).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181bce8;
  (this->fSideOrient).super_TPZVec<int>.fStore = (this->fSideOrient).fExtAlloc;
  (this->fSideOrient).super_TPZVec<int>.fNElements = 3;
  (this->fSideOrient).super_TPZVec<int>.fNAlloc = 0;
  (this->fSideOrient).fExtAlloc[0] = 1;
  (this->fSideOrient).fExtAlloc[1] = 1;
  (this->fSideOrient).fExtAlloc[2] = 1;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node._M_size = 0;
  TPZVec<long>::TPZVec(&(this->fConnectIndexes).super_TPZVec<long>,0);
  (this->fConnectIndexes).super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01878bc8;
  (this->fConnectIndexes).super_TPZVec<long>.fStore = (this->fConnectIndexes).fExtAlloc;
  (this->fConnectIndexes).super_TPZVec<long>.fNElements = 4;
  (this->fConnectIndexes).super_TPZVec<long>.fNAlloc = 0;
  *(undefined4 *)(this->fConnectIndexes).fExtAlloc = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 4) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 1) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0xc) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 2) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x14) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 3) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x1c) = 0xffffffff;
  this->fhdivfam = hdivfam;
  (this->super_TPZIntelGen<pzshape::TPZShapeTriang>).super_TPZInterpolatedElement.
  super_TPZInterpolationSpace.fPreferredOrder = mesh->fDefaultOrder;
  TPZManVector<long,_4>::Resize(&this->fConnectIndexes,4);
  gel->fReference = (TPZCompEl *)this;
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
  pztopology::TPZTriangle::LowerDimensionSides(6,(TPZStack<int,_10> *)&local_78,1);
  TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_78,6);
  if (0 < local_78.super_TPZVec<int>.fNElements) {
    lVar6 = 0;
    do {
      iVar1 = local_78.super_TPZVec<int>.fStore[lVar6];
      nelem = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x370))(this,iVar1);
      (this->fConnectIndexes).super_TPZVec<long>.fStore[lVar6] = nelem;
      pTVar4 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(mesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,nelem);
      pTVar4->fNElConnected = pTVar4->fNElConnected + 1;
      (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                             super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                             super_TPZCompEl + 0x378))(this,iVar1);
      lVar6 = lVar6 + 1;
    } while (lVar6 < local_78.super_TPZVec<int>.fNElements);
  }
  iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x338))(this);
  this_00 = &(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).fIntRule;
  iVar2 = TPZIntTriang::GetMaxOrder(this_00);
  iVar1 = iVar1 * 2 + 2;
  if (iVar2 < iVar1) {
    iVar1 = TPZIntTriang::GetMaxOrder(this_00);
  }
  TPZVec<int>::TPZVec(&local_d8,0);
  local_d8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181bce8;
  local_d8.fNElements = 3;
  local_d8.fNAlloc = 0;
  local_d8.fStore = &local_b8;
  local_b8 = iVar1;
  local_b4 = iVar1;
  local_b0 = iVar1;
  TPZIntTriang::SetOrder(this_00,&local_d8,0);
  lVar6 = 0;
  do {
    this_01 = TPZCompEl::Reference((TPZCompEl *)this);
    iVar1 = TPZGeoEl::NormalOrientation(this_01,(int)lVar6 + 3);
    (this->fSideOrient).super_TPZVec<int>.fStore[lVar6] = iVar1;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  lVar6 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0xb8))(this);
  if (lVar6 != 0) {
    plVar5 = (long *)__dynamic_cast(lVar6,&TPZMaterial::typeinfo,&TPZMatSingleSpace::typeinfo,
                                    0xfffffffffffffffe);
    if (plVar5 != (long *)0x0) {
      uVar3 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x268))(this);
      local_dc = (**(code **)(*plVar5 + 0x58))(plVar5,uVar3);
      iVar1 = (**(code **)(*(long *)gel + 0x210))(gel);
      TPZManVector<int,_3>::TPZManVector(&local_a8,(long)iVar1,&local_dc);
      TPZIntTriang::SetOrder(this_00,&local_a8.super_TPZVec<int>,0);
      if (local_a8.super_TPZVec<int>.fStore != local_a8.fExtAlloc) {
        local_a8.super_TPZVec<int>.fNAlloc = 0;
        local_a8.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
        if (local_a8.super_TPZVec<int>.fStore != (int *)0x0) {
          operator_delete__(local_a8.super_TPZVec<int>.fStore);
        }
      }
    }
  }
  if (this->fhdivfam == EHDivConstant) {
    iVar1 = 0;
    while( true ) {
      iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x90))(this);
      if (iVar2 <= iVar1) break;
      lVar6 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0xa8))(this,iVar1);
      iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x260))
                        (this,iVar1,*(undefined1 *)(lVar6 + 0x14));
      if (*(int *)(lVar6 + 0x18) != iVar2) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
                   ,0x67);
      }
      iVar1 = iVar1 + 1;
    }
  }
  if (local_d8.fStore != &local_b8) {
    local_d8.fNAlloc = 0;
    local_d8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_d8.fStore != (int *)0x0) {
      operator_delete__(local_d8.fStore);
    }
  }
  TPZManVector<int,_10>::~TPZManVector(&local_78);
  return;
}

Assistant:

TPZCompElHDiv<TSHAPE>::TPZCompElHDiv(TPZCompMesh &mesh, TPZGeoEl *gel, const HDivFamily hdivfam) :
TPZRegisterClassId(&TPZCompElHDiv::ClassId),
TPZIntelGen<TSHAPE>(mesh,gel,1), fSideOrient(TSHAPE::NFacets,1), fhdivfam(hdivfam) {
	this->TPZInterpolationSpace::fPreferredOrder = mesh.GetDefaultOrder();
	int nconflux= TPZCompElHDiv::NConnects();
    this->fConnectIndexes.Resize(nconflux);
	gel->SetReference(this);

//    int nfaces = TSHAPE::NumSides(TSHAPE::Dimension-1);
    TPZStack<int> facesides;
    TSHAPE::LowerDimensionSides(TSHAPE::NSides-1,facesides,TSHAPE::Dimension-1);
    facesides.Push(TSHAPE::NSides-1);
	for(int i=0;i< facesides.size(); i++)
	{
        int sideaux= facesides[i];
		this->fConnectIndexes[i] = this->CreateMidSideConnect(sideaux);
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "After creating last flux connect " << i << std::endl;
            //	this->Print(sout);
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif

		mesh.ConnectVec()[this->fConnectIndexes[i]].IncrementElConnected();
		this->IdentifySideOrder(sideaux);
    }


    int sideorder = EffectiveSideOrder(TSHAPE::NSides-1);
//    if(TSHAPE::Type()==EQuadrilateral)
//    {
//        sideorder++;
//    }

    sideorder++;

	sideorder = 2*sideorder;
	if (sideorder > this->fIntRule.GetMaxOrder()) sideorder = this->fIntRule.GetMaxOrder();
	TPZManVector<int,3> order(3,sideorder);
	this->fIntRule.SetOrder(order);
    int firstside = TSHAPE::NSides-TSHAPE::NFacets-1;
    for(int side = firstside ; side < TSHAPE::NSides-1; side++ )
    {
        fSideOrient[side-firstside] = this->Reference()->NormalOrientation(side);
    }
    auto *mat =
        dynamic_cast<TPZMatSingleSpace *>(this->Material());
    if (mat)
    {
        int order = mat->IntegrationRuleOrder(MaxOrder());
        TPZManVector<int,3> ord(gel->Dimension(),order);
        this->fIntRule.SetOrder(ord);
    }

    if (fhdivfam == HDivFamily::EHDivConstant) {
        // For HDiv constant, polynomial order was compatibilized in connectorders, 
        // see TPZShapeHDivConstant<TSHAPE>::Initialize. So now we need to update
        // the number of shape functions and also the integration rule
        if (TSHAPE::Type() == ETriangle || TSHAPE::Type() == EQuadrilateral || TSHAPE::Type() == ETetraedro){
            for (int icon = 0; icon < this->NConnects(); icon++)
            {
                TPZConnect &c = this->Connect(icon);
                int nShapeF = NConnectShapeF(icon,c.Order());
                if (c.NShape() != nShapeF){
                    DebugStop();
                }
            }
        }
    }
}